

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

vector<CAddress,_std::allocator<CAddress>_> * __thiscall
CConnman::GetCurrentBlockRelayOnlyConns
          (vector<CAddress,_std::allocator<CAddress>_> *__return_storage_ptr__,CConnman *this)

{
  pointer ppCVar1;
  pointer ppCVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock78;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  ppCVar1 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar2 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar2 != ppCVar1; ppCVar2 = ppCVar2 + 1) {
    if ((*ppCVar2)->m_conn_type == BLOCK_RELAY) {
      std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                (__return_storage_ptr__,&(*ppCVar2)->addr);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CAddress> CConnman::GetCurrentBlockRelayOnlyConns() const
{
    std::vector<CAddress> ret;
    LOCK(m_nodes_mutex);
    for (const CNode* pnode : m_nodes) {
        if (pnode->IsBlockOnlyConn()) {
            ret.push_back(pnode->addr);
        }
    }

    return ret;
}